

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O3

void Am_Get_Filtered_Input(Am_Object *inter,Am_Object *ref_obj,int x,int y,int *out_x,int *out_y)

{
  Am_Custom_Gridding_Method_Type *pAVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  int iVar8;
  Am_Value value;
  Am_Custom_Gridding_Method method;
  Am_Object local_68;
  Am_Value local_60;
  int *local_50;
  Am_Custom_Gridding_Method local_48;
  
  local_60.type = 0;
  local_60.value.wrapper_value = (Am_Wrapper *)0x0;
  local_50 = out_y;
  pAVar7 = Am_Object::Get(inter,0xd2,0);
  Am_Value::operator=(&local_60,pAVar7);
  bVar2 = Am_Value::Valid(&local_60);
  if (bVar2) {
    local_48.from_wrapper = (Am_Method_Wrapper *)0x0;
    local_48.Call = (Am_Custom_Gridding_Method_Type *)0x0;
    Am_Custom_Gridding_Method::operator=(&local_48,&local_60);
    pAVar1 = local_48.Call;
    Am_Object::Am_Object(&local_68,inter);
    (*pAVar1)((Am_Object_Data *)&local_68,ref_obj,x,y,out_x,local_50);
    Am_Object::~Am_Object(&local_68);
  }
  else {
    pAVar7 = Am_Object::Get(inter,0xce,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar7);
    if (iVar3 == 0) {
      *out_x = x;
    }
    else {
      pAVar7 = Am_Object::Get(inter,0xcf,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar7);
      if (iVar4 == 0) {
        iVar4 = iVar3;
      }
      pAVar7 = Am_Object::Get(inter,0xd0,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(inter,0xd1,0);
      iVar6 = Am_Value::operator_cast_to_int(pAVar7);
      iVar8 = iVar3 / 2 + x;
      *out_x = iVar8 - (iVar8 - iVar5) % iVar3;
      iVar3 = iVar4 / 2 + y;
      y = iVar3 - (iVar3 - iVar6) % iVar4;
    }
    *local_50 = y;
  }
  Am_Value::~Am_Value(&local_60);
  return;
}

Assistant:

void
Am_Get_Filtered_Input(Am_Object inter, const Am_Object &ref_obj, int x, int y,
                      int &out_x, int &out_y)
{
  Am_Value value;
  value = inter.Get(Am_GRID_METHOD);
  if (value.Valid()) {
    Am_Custom_Gridding_Method method;
    method = value;
    Am_INTER_TRACE_PRINT(inter, "Custom Gridding function " << method);
    method.Call(inter, ref_obj, x, y, out_x, out_y);
    Am_INTER_TRACE_PRINT(inter, "     maps (" << x << "," << y << " to ("
                                              << out_x << "," << out_y << ")");
  } else { // if no procedure, check gridding by numbers
    int grid_x = inter.Get(Am_GRID_X);
    if (grid_x) { // then do some gridding by number
      int grid_y = inter.Get(Am_GRID_Y);
      if (!grid_y)
        grid_y = grid_x; // use same value in each
                         // direction if y not supplied
      // ok for origins to be zero
      int grid_origin_x = inter.Get(Am_GRID_ORIGIN_X);
      int grid_origin_y = inter.Get(Am_GRID_ORIGIN_Y);
      int grid_x_div_2 = grid_x / 2;
      int grid_y_div_2 = grid_y / 2;

      out_x = grid_origin_x +
              (grid_x * (((x + grid_x_div_2) - grid_origin_x) / grid_x));
      out_y = grid_origin_y +
              (grid_y * (((y + grid_y_div_2) - grid_origin_y) / grid_y));
      Am_INTER_TRACE_PRINT(inter, "Gridding maps (" << x << "," << y << " to ("
                                                    << out_x << "," << out_y
                                                    << ")");
    } else {
      out_x = x;
      out_y = y;
    }
  }
}